

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O3

char * ucurr_nextCurrencyList(UEnumeration *enumerator,int32_t *resultLength,UErrorCode *param_3)

{
  uint uVar1;
  uint *puVar2;
  uint32_t *puVar3;
  ulong uVar4;
  ulong uVar5;
  uint32_t *puVar6;
  
  puVar2 = (uint *)enumerator->context;
  uVar1 = puVar2[1];
  uVar4 = (ulong)uVar1;
  uVar5 = 0x12f;
  if (0x12f < uVar1) {
    uVar5 = (ulong)uVar1;
  }
  puVar3 = &gCurrencyList[uVar4].currType;
  do {
    puVar6 = puVar3;
    if (uVar5 == uVar4) {
      if (resultLength != (int32_t *)0x0) {
        *resultLength = 0;
      }
      return (char *)0x0;
    }
    puVar2[1] = (int)uVar4 + 1;
    if (*puVar2 == 0x7fffffff) break;
    uVar4 = uVar4 + 1;
    puVar3 = puVar6 + 4;
  } while ((*puVar2 & ~*puVar6) != 0);
  if (resultLength != (int32_t *)0x0) {
    *resultLength = 3;
  }
  return ((CurrencyList *)(puVar6 + -2))->currency;
}

Assistant:

static const char* U_CALLCONV
ucurr_nextCurrencyList(UEnumeration *enumerator,
                        int32_t* resultLength,
                        UErrorCode * /*pErrorCode*/)
{
    UCurrencyContext *myContext = (UCurrencyContext *)(enumerator->context);

    /* Find the next in the list that matches the type we are looking for. */
    while (myContext->listIdx < UPRV_LENGTHOF(gCurrencyList)-1) {
        const struct CurrencyList *currItem = &gCurrencyList[myContext->listIdx++];
        if (UCURR_MATCHES_BITMASK(currItem->currType, myContext->currType))
        {
            if (resultLength) {
                *resultLength = 3; /* Currency codes are only 3 chars long */
            }
            return currItem->currency;
        }
    }
    /* We enumerated too far. */
    if (resultLength) {
        *resultLength = 0;
    }
    return NULL;
}